

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

bool __thiscall QMdiArea::event(QMdiArea *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  QMdiAreaPrivate *pQVar3;
  const_iterator o;
  QObject *pQVar4;
  QEvent *in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *window;
  QList<QPointer<QMdiSubWindow>_> *__range2;
  QMdiAreaPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QPointer<QMdiSubWindow>_> subWindows;
  QMdiSubWindow *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined8 in_stack_ffffffffffffff88;
  undefined2 uVar5;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  QMdiAreaPrivate *this_00;
  
  uVar5 = (undefined2)((ulong)in_stack_ffffffffffffff88 >> 0x30);
  this_00 = *(QMdiAreaPrivate **)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QMdiArea *)0x615045);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == Hide) {
    ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x615271);
    uVar5 = (undefined2)((ulong)pQVar3 >> 0x30);
    QMdiAreaPrivate::setActive
              ((QMdiAreaPrivate *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,false,false);
    QMdiAreaPrivate::setChildActivationEnabled(in_RDI,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
  }
  else if (TVar2 == WindowActivate) {
    pQVar3->isActivated = true;
    bVar1 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x6150cc);
    if (!bVar1) {
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x6150e8);
      if (!bVar1) {
        QMdiAreaPrivate::activateCurrentWindow
                  ((QMdiAreaPrivate *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80))
        ;
      }
      QMdiAreaPrivate::setChildActivationEnabled(in_RDI,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
    }
  }
  else if (TVar2 == WindowDeactivate) {
    pQVar3->isActivated = false;
    QMdiAreaPrivate::setChildActivationEnabled(in_RDI,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
  }
  else if (TVar2 == WindowIconChange) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QPointer<QMdiSubWindow>_>::QList
              ((QList<QPointer<QMdiSubWindow>_> *)
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               (QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff78);
    local_28.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QPointer<QMdiSubWindow>_>::begin
                         ((QList<QPointer<QMdiSubWindow>_> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    o = QList<QPointer<QMdiSubWindow>_>::end
                  ((QList<QPointer<QMdiSubWindow>_> *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    while (bVar1 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_28,o), bVar1)
    {
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_28);
      pQVar4 = (QObject *)
               ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x615211);
      bVar1 = sanityCheck((QMdiSubWindow *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          (char *)in_stack_ffffffffffffff78);
      if (bVar1) {
        QCoreApplication::sendEvent(pQVar4,in_RSI);
      }
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_28);
    }
    QList<QPointer<QMdiSubWindow>_>::~QList((QList<QPointer<QMdiSubWindow>_> *)0x615254);
  }
  else if (TVar2 == LayoutDirectionChange) {
    QMdiAreaPrivate::updateTabBarGeometry(this_00);
  }
  else if ((TVar2 == StyleChange) && ((pQVar3->isSubWindowsTiled & 1U) != 0)) {
    tileSubWindows((QMdiArea *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    pQVar3->isSubWindowsTiled = true;
  }
  bVar1 = QAbstractScrollArea::event((QAbstractScrollArea *)subWindows.d.d,(QEvent *)__begin2.i);
  if (*(QMdiAreaPrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QMdiArea::event(QEvent *event)
{
    Q_D(QMdiArea);
    switch (event->type()) {
    case QEvent::WindowActivate: {
        d->isActivated = true;
        if (d->childWindows.isEmpty())
            break;
        if (!d->active)
            d->activateCurrentWindow();
        d->setChildActivationEnabled(false, true);
        break;
    }
    case QEvent::WindowDeactivate:
        d->isActivated = false;
        d->setChildActivationEnabled(false, true);
        break;
    case QEvent::StyleChange:
        // Re-tile the views if we're in tiled mode. Re-tile means we will change
        // the geometry of the children, which in turn means 'isSubWindowsTiled'
        // is set to false, so we have to update the state at the end.
        if (d->isSubWindowsTiled) {
            tileSubWindows();
            d->isSubWindowsTiled = true;
        }
        break;
    case QEvent::WindowIconChange: {
        // Take a copy because QCoreApplication::sendEvent() may call unknown code,
        // that may cause recursing into the class
        const auto subWindows = d->childWindows;
        for (QMdiSubWindow *window : subWindows) {
            if (sanityCheck(window, "QMdiArea::WindowIconChange"))
                QCoreApplication::sendEvent(window, event);
        }
        break;
    }
    case QEvent::Hide:
        d->setActive(d->active, false, false);
        d->setChildActivationEnabled(false);
        break;
#if QT_CONFIG(tabbar)
    case QEvent::LayoutDirectionChange:
        d->updateTabBarGeometry();
        break;
#endif
    default:
        break;
    }
    return QAbstractScrollArea::event(event);
}